

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void Cmd_setslot(FCommandLine *argv,APlayerPawn *who,int key)

{
  FWeaponSlot *pFVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  MetaClass *pMVar5;
  PClass *p;
  PClassWeapon *type;
  long lVar6;
  int local_48;
  int local_44;
  int i_1;
  int i;
  undefined1 local_28 [8];
  FString config;
  int slot;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  config.Chars._4_4_ = key;
  iVar3 = FCommandLine::argc(argv);
  if (1 < iVar3) {
    pcVar4 = FCommandLine::operator[](argv,1);
    config.Chars._0_4_ = atoi(pcVar4);
    if ((int)(uint)config.Chars < 10) {
      if ((ParsingKeyConf & 1U) != 0) {
        pcVar4 = FCommandLine::args(argv);
        FString::FString((FString *)&i_1,pcVar4);
        TArray<FString,_FString>::Push(&KeyConfWeapons,(FString *)&i_1);
        FString::~FString((FString *)&i_1);
        return;
      }
      if (PlayingKeyConf != (FWeaponSlots *)0x0) {
        FWeaponSlot::Clear(PlayingKeyConf->Slots + (int)(uint)config.Chars);
        for (local_44 = 2; iVar3 = FCommandLine::argc(argv), local_44 < iVar3;
            local_44 = local_44 + 1) {
          lVar6 = (long)(int)(uint)config.Chars;
          pFVar1 = PlayingKeyConf->Slots;
          pcVar4 = FCommandLine::operator[](argv,local_44);
          FWeaponSlot::AddWeapon(pFVar1 + lVar6,pcVar4);
        }
        return;
      }
      iVar3 = FCommandLine::argc(argv);
      if (iVar3 == 2) {
        Printf("Slot %d cleared\n",(ulong)(uint)config.Chars);
      }
      Net_WriteByte('9');
      Net_WriteByte((BYTE)(uint)config.Chars);
      iVar3 = FCommandLine::argc(argv);
      Net_WriteByte((char)iVar3 + 0xfe);
      for (local_48 = 2; iVar3 = FCommandLine::argc(argv), local_48 < iVar3; local_48 = local_48 + 1
          ) {
        pcVar4 = FCommandLine::operator[](argv,local_48);
        p = PClass::FindClass(pcVar4);
        type = dyn_cast<PClassWeapon>((DObject *)p);
        Net_WriteWeapon(type);
      }
      return;
    }
  }
  Printf("Usage: setslot [slot] [weapons]\nCurrent slot assignments:\n");
  if ((&players)[(long)consoleplayer * 0x54] != 0) {
    FGameConfigFile::GetConfigPath((FGameConfigFile *)local_28,SUB81(GameConfig,0));
    pcVar4 = FString::GetChars((FString *)local_28);
    Printf("\x1cHAdd the following to \x1cI%s\x1cH to retain these bindings:\n\x1c-[",pcVar4);
    bVar2 = FString::IsNotEmpty(&WeaponSection);
    if (bVar2) {
      pcVar4 = FString::GetChars(&WeaponSection);
      Printf("%s.",pcVar4);
    }
    pMVar5 = APlayerPawn::GetClass((APlayerPawn *)(&players)[(long)consoleplayer * 0x54]);
    pcVar4 = FName::GetChars(&(pMVar5->super_PClassActor).super_PClass.super_PNativeStruct.
                              super_PStruct.super_PNamedType.TypeName);
    Printf("%s.Weapons]\n",pcVar4);
    FString::~FString((FString *)local_28);
  }
  FWeaponSlots::PrintSettings((FWeaponSlots *)((long)consoleplayer * 0x2a0 + 0x1ae72a0));
  return;
}

Assistant:

CCMD (setslot)
{
	int slot;

	if (argv.argc() < 2 || (slot = atoi (argv[1])) >= NUM_WEAPON_SLOTS)
	{
		Printf("Usage: setslot [slot] [weapons]\nCurrent slot assignments:\n");
		if (players[consoleplayer].mo != NULL)
		{
			FString config(GameConfig->GetConfigPath(false));
			Printf(TEXTCOLOR_BLUE "Add the following to " TEXTCOLOR_ORANGE "%s" TEXTCOLOR_BLUE
				" to retain these bindings:\n" TEXTCOLOR_NORMAL "[", config.GetChars());
			if (WeaponSection.IsNotEmpty())
			{
				Printf("%s.", WeaponSection.GetChars());
			}
			Printf("%s.Weapons]\n", players[consoleplayer].mo->GetClass()->TypeName.GetChars());
		}
		players[consoleplayer].weapons.PrintSettings();
		return;
	}

	if (ParsingKeyConf)
	{
		KeyConfWeapons.Push(argv.args());
	}
	else if (PlayingKeyConf != NULL)
	{
		PlayingKeyConf->Slots[slot].Clear();
		for (int i = 2; i < argv.argc(); ++i)
		{
			PlayingKeyConf->Slots[slot].AddWeapon(argv[i]);
		}
	}
	else
	{
		if (argv.argc() == 2)
		{
			Printf ("Slot %d cleared\n", slot);
		}

		Net_WriteByte(DEM_SETSLOT);
		Net_WriteByte(slot);
		Net_WriteByte(argv.argc()-2);
		for (int i = 2; i < argv.argc(); i++)
		{
			Net_WriteWeapon(dyn_cast<PClassWeapon>(PClass::FindClass(argv[i])));
		}
	}
}